

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleScanner::parse(RBBIRuleScanner *this)

{
  UBool UVar1;
  int32_t *local_20;
  RBBIRuleTableEl *tableEl;
  uint16_t state;
  RBBIRuleScanner *this_local;
  
  UVar1 = ::U_FAILURE(*this->fRB->fStatus);
  if (UVar1 == '\0') {
    tableEl._6_2_ = 1;
    nextChar(this,&this->fC);
    while ((UVar1 = ::U_FAILURE(*this->fRB->fStatus), UVar1 == '\0' && (tableEl._6_2_ != 0))) {
      local_20 = (int32_t *)(gRuleParseStateTable + (ulong)tableEl._6_2_ * 8);
      while ((((((0x7e < *(byte *)(local_20 + 1) || ((this->fC).fEscaped != '\0')) ||
                ((uint)*(byte *)(local_20 + 1) != (this->fC).fChar)) && ((char)local_20[1] != -1))
              && (((char)local_20[1] != -2 || ((this->fC).fEscaped == '\0')))) &&
             (((((char)local_20[1] != -3 || ((this->fC).fEscaped == '\0')) ||
               (((this->fC).fChar != 0x50 && ((this->fC).fChar != 0x70)))) &&
              ((((char)local_20[1] != -4 || ((this->fC).fChar != -1)) &&
               ((((*(byte *)(local_20 + 1) < 0x80 || (0xef < *(byte *)(local_20 + 1))) ||
                 ((this->fC).fEscaped != '\0')) ||
                (((this->fC).fChar == -1 ||
                 (UVar1 = UnicodeSet::contains
                                    ((UnicodeSet *)
                                     (&this->field_0x480 +
                                     (long)(int)(*(byte *)(local_20 + 1) - 0x80) * 0x58),
                                     (this->fC).fChar), UVar1 == '\0'))))))))))) {
        local_20 = local_20 + 2;
      }
      if (this->fRB->fDebugEnv != (char *)0x0) {
        strstr(this->fRB->fDebugEnv,"scan");
      }
      UVar1 = doParseActions(this,*local_20);
      if (UVar1 == '\0') break;
      if (*(char *)((long)local_20 + 6) != '\0') {
        this->fStackPtr = this->fStackPtr + 1;
        if (99 < this->fStackPtr) {
          error(this,U_BRK_ERROR_START);
          this->fStackPtr = this->fStackPtr + -1;
        }
        this->fStack[this->fStackPtr] = (ushort)*(byte *)((long)local_20 + 6);
      }
      if (*(char *)((long)local_20 + 7) != '\0') {
        nextChar(this,&this->fC);
      }
      if (*(char *)((long)local_20 + 5) == -1) {
        tableEl._6_2_ = this->fStack[this->fStackPtr];
        this->fStackPtr = this->fStackPtr + -1;
        if (this->fStackPtr < 0) {
          error(this,U_BRK_ERROR_START);
          this->fStackPtr = this->fStackPtr + 1;
        }
      }
      else {
        tableEl._6_2_ = (uint16_t)*(byte *)((long)local_20 + 5);
      }
    }
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if ((UVar1 == '\0') && (this->fRB->fForwardTree == (RBBINode *)0x0)) {
      error(this,U_BRK_RULE_SYNTAX);
    }
  }
  return;
}

Assistant:

void RBBIRuleScanner::parse() {
    uint16_t                state;
    const RBBIRuleTableEl  *tableEl;

    if (U_FAILURE(*fRB->fStatus)) {
        return;
    }

    state = 1;
    nextChar(fC);
    //
    // Main loop for the rule parsing state machine.
    //   Runs once per state transition.
    //   Each time through optionally performs, depending on the state table,
    //      - an advance to the the next input char
    //      - an action to be performed.
    //      - pushing or popping a state to/from the local state return stack.
    //
    for (;;) {
        //  Bail out if anything has gone wrong.
        //  RBBI rule file parsing stops on the first error encountered.
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }

        // Quit if state == 0.  This is the normal way to exit the state machine.
        //
        if (state == 0) {
            break;
        }

        // Find the state table element that matches the input char from the rule, or the
        //    class of the input character.  Start with the first table row for this
        //    state, then linearly scan forward until we find a row that matches the
        //    character.  The last row for each state always matches all characters, so
        //    the search will stop there, if not before.
        //
        tableEl = &gRuleParseStateTable[state];
        #ifdef RBBI_DEBUG
            if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) {
                RBBIDebugPrintf("char, line, col = (\'%c\', %d, %d)    state=%s ",
                    fC.fChar, fLineNum, fCharNum, RBBIRuleStateNames[state]);
            }
        #endif

        for (;;) {
            #ifdef RBBI_DEBUG
                if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) { RBBIDebugPrintf("."); fflush(stdout);}
            #endif
            if (tableEl->fCharClass < 127 && fC.fEscaped == FALSE &&   tableEl->fCharClass == fC.fChar) {
                // Table row specified an individual character, not a set, and
                //   the input character is not escaped, and
                //   the input character matched it.
                break;
            }
            if (tableEl->fCharClass == 255) {
                // Table row specified default, match anything character class.
                break;
            }
            if (tableEl->fCharClass == 254 && fC.fEscaped)  {
                // Table row specified "escaped" and the char was escaped.
                break;
            }
            if (tableEl->fCharClass == 253 && fC.fEscaped &&
                (fC.fChar == 0x50 || fC.fChar == 0x70 ))  {
                // Table row specified "escaped P" and the char is either 'p' or 'P'.
                break;
            }
            if (tableEl->fCharClass == 252 && fC.fChar == (UChar32)-1)  {
                // Table row specified eof and we hit eof on the input.
                break;
            }

            if (tableEl->fCharClass >= 128 && tableEl->fCharClass < 240 &&   // Table specs a char class &&
                fC.fEscaped == FALSE &&                                      //   char is not escaped &&
                fC.fChar != (UChar32)-1) {                                   //   char is not EOF
                U_ASSERT((tableEl->fCharClass-128) < UPRV_LENGTHOF(fRuleSets));
                if (fRuleSets[tableEl->fCharClass-128].contains(fC.fChar)) {
                    // Table row specified a character class, or set of characters,
                    //   and the current char matches it.
                    break;
                }
            }

            // No match on this row, advance to the next  row for this state,
            tableEl++;
        }
        if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) { RBBIDebugPuts("");}

        //
        // We've found the row of the state table that matches the current input
        //   character from the rules string.
        // Perform any action specified  by this row in the state table.
        if (doParseActions((int32_t)tableEl->fAction) == FALSE) {
            // Break out of the state machine loop if the
            //   the action signalled some kind of error, or
            //   the action was to exit, occurs on normal end-of-rules-input.
            break;
        }

        if (tableEl->fPushState != 0) {
            fStackPtr++;
            if (fStackPtr >= kStackSize) {
                error(U_BRK_INTERNAL_ERROR);
                RBBIDebugPuts("RBBIRuleScanner::parse() - state stack overflow.");
                fStackPtr--;
            }
            fStack[fStackPtr] = tableEl->fPushState;
        }

        if (tableEl->fNextChar) {
            nextChar(fC);
        }

        // Get the next state from the table entry, or from the
        //   state stack if the next state was specified as "pop".
        if (tableEl->fNextState != 255) {
            state = tableEl->fNextState;
        } else {
            state = fStack[fStackPtr];
            fStackPtr--;
            if (fStackPtr < 0) {
                error(U_BRK_INTERNAL_ERROR);
                RBBIDebugPuts("RBBIRuleScanner::parse() - state stack underflow.");
                fStackPtr++;
            }
        }

    }

    if (U_FAILURE(*fRB->fStatus)) {
        return;
    }
    
    // If there are no forward rules set an error.
    //
    if (fRB->fForwardTree == NULL) {
        error(U_BRK_RULE_SYNTAX);
        return;
    }

    //
    // Parsing of the input RBBI rules is complete.
    // We now have a parse tree for the rule expressions
    // and a list of all UnicodeSets that are referenced.
    //
#ifdef RBBI_DEBUG
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "symbols")) {fSymbolTable->rbbiSymtablePrint();}
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "ptree")) {
        RBBIDebugPrintf("Completed Forward Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fForwardTree, TRUE);
        RBBIDebugPrintf("\nCompleted Reverse Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fReverseTree, TRUE);
        RBBIDebugPrintf("\nCompleted Safe Point Forward Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fSafeFwdTree, TRUE);
        RBBIDebugPrintf("\nCompleted Safe Point Reverse Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fSafeRevTree, TRUE);
    }
#endif
}